

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_multi(secp256k1_scratch *scratch,secp256k1_ecmult_multi_func ecmult_multi)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint64_t uVar69;
  uint64_t uVar70;
  uint64_t uVar71;
  int iVar72;
  int iVar73;
  ulong uVar74;
  uint uVar75;
  long lVar76;
  secp256k1_scalar *psVar77;
  long lVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar84;
  secp256k1_gej *psVar85;
  secp256k1_gej *psVar86;
  secp256k1_ge *psVar87;
  secp256k1_strauss_point_state *psVar88;
  secp256k1_ge *psVar89;
  uint64_t *puVar90;
  secp256k1_strauss_point_state *psVar91;
  code *cb;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  secp256k1_scalar **cbdata;
  secp256k1_scalar **ppsVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  long lVar104;
  byte bVar105;
  ecmult_multi_data data;
  secp256k1_scalar t1;
  secp256k1_gej t1p;
  secp256k1_scalar t0;
  secp256k1_gej r;
  secp256k1_gej ptgj;
  secp256k1_scalar tmp1;
  secp256k1_gej expected;
  secp256k1_scalar tmp2;
  secp256k1_ge ptg;
  secp256k1_gej r2;
  secp256k1_fe aux [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  secp256k1_ge ptg_4;
  secp256k1_ge pt [32];
  secp256k1_scratch *local_1f00;
  secp256k1_scalar *local_1ef0;
  secp256k1_ge *local_1ee8;
  secp256k1_scalar *local_1ee0;
  ulong local_1ed8;
  ulong local_1ed0;
  ulong local_1ec8;
  ulong local_1ec0;
  ulong local_1eb8;
  ulong local_1eb0;
  ulong local_1ea8;
  secp256k1_scalar local_1ea0;
  secp256k1_strauss_state local_1e80;
  secp256k1_gej local_1e68;
  secp256k1_scalar local_1dd0;
  undefined1 local_1db0 [152];
  secp256k1_gej local_1d18;
  secp256k1_scalar local_1c80;
  secp256k1_gej local_1c60;
  secp256k1_scalar local_1bc8;
  secp256k1_scalar local_1ba8;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  secp256k1_scalar local_17c8;
  secp256k1_gej local_17a8;
  secp256k1_gej local_1710;
  secp256k1_fe local_1678 [8];
  undefined1 local_14f8 [1040];
  secp256k1_ge local_10e8 [8];
  secp256k1_ge local_da0;
  secp256k1_ge local_d38;
  secp256k1_ge local_cd0 [31];
  
  bVar105 = 0;
  local_1ef0 = &local_1bc8;
  cbdata = &local_1ef0;
  local_1ee8 = &local_d38;
  psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = ecmult_multi_callback;
  psVar77 = (secp256k1_scalar *)0x0;
  psVar85 = (secp256k1_gej *)scratch;
  iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0,
                           (secp256k1_scalar *)0x0,ecmult_multi_callback,cbdata,0);
  if (iVar72 == 0) goto LAB_0015b5c2;
  local_1f00 = scratch;
  if (0 < COUNT) {
    iVar72 = 0;
    do {
      local_1ee0 = (secp256k1_scalar *)CONCAT44(local_1ee0._4_4_,iVar72);
      psVar77 = &local_1bc8;
      random_scalar_order(psVar77);
      random_scalar_order(&local_1ba8);
      random_group_element_test((secp256k1_ge *)&local_17a8);
      secp256k1_gej_set_ge(&local_1d18,(secp256k1_ge *)&local_17a8);
      local_1e68.x.n[2] = (uint64_t)local_14f8;
      psVar86 = &local_1710;
      psVar85 = &local_17a8;
      psVar84 = &local_d38;
      for (lVar76 = 0xd; lVar76 != 0; lVar76 = lVar76 + -1) {
        (psVar84->x).n[0] = (psVar85->x).n[0];
        psVar85 = (secp256k1_gej *)((long)psVar85 + (ulong)bVar105 * -0x10 + 8);
        psVar84 = (secp256k1_ge *)((long)psVar84 + ((ulong)bVar105 * -2 + 1) * 8);
      }
      psVar84 = &secp256k1_ge_const_g;
      psVar87 = local_cd0;
      for (lVar76 = 0xd; lVar76 != 0; lVar76 = lVar76 + -1) {
        (psVar87->x).n[0] = (psVar84->x).n[0];
        psVar84 = (secp256k1_ge *)((long)psVar84 + ((ulong)bVar105 * -2 + 1) * 8);
        psVar87 = (secp256k1_ge *)((long)psVar87 + ((ulong)bVar105 * -2 + 1) * 8);
      }
      local_1e68.x.n[0] = (uint64_t)local_1678;
      local_1e68.x.n[1] = (uint64_t)local_10e8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e68,psVar86,1,&local_1d18,&secp256k1_scalar_zero
                 ,psVar77);
      psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      cbdata = &local_1ef0;
      psVar85 = (secp256k1_gej *)scratch;
      ppsVar97 = cbdata;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0,
                               psVar77,ecmult_multi_callback,cbdata,0);
      if (iVar72 == 0) goto LAB_0015b581;
      psVar85 = psVar86;
      psVar88 = (secp256k1_strauss_point_state *)local_1db0;
      iVar72 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar86);
      if (iVar72 == 0) goto LAB_0015b586;
      local_1e68.x.n[0] = (uint64_t)local_1678;
      local_1e68.x.n[1] = (uint64_t)local_10e8;
      local_1e68.x.n[2] = (uint64_t)local_14f8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e68,psVar86,1,&local_1d18,&local_1bc8,
                 &secp256k1_scalar_zero);
      psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar77 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      psVar85 = (secp256k1_gej *)scratch;
      ppsVar97 = cbdata;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0,
                               &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,1);
      if (iVar72 == 0) goto LAB_0015b58b;
      psVar88 = (secp256k1_strauss_point_state *)local_1db0;
      iVar72 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar86);
      if (iVar72 == 0) goto LAB_0015b590;
      psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar77 = &secp256k1_scalar_zero;
      cb = ecmult_multi_false_callback;
      psVar86 = (secp256k1_gej *)scratch;
      ppsVar97 = cbdata;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0,
                               &secp256k1_scalar_zero,ecmult_multi_false_callback,cbdata,1);
      if (iVar72 != 0) goto LAB_0015b595;
      local_1e68.x.n[0] = (uint64_t)local_1678;
      local_1e68.x.n[1] = (uint64_t)local_10e8;
      local_1e68.x.n[2] = (uint64_t)local_14f8;
      psVar85 = &local_1710;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e68,psVar85,1,&local_1d18,&local_1bc8,
                 &local_1ba8);
      psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar77 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      psVar86 = (secp256k1_gej *)scratch;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0,
                               &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,2);
      if (iVar72 == 0) goto LAB_0015b59a;
      psVar86 = psVar85;
      psVar88 = (secp256k1_strauss_point_state *)local_1db0;
      iVar72 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar85);
      if (iVar72 == 0) goto LAB_0015b59f;
      local_1e68.x.n[0] = (uint64_t)local_1678;
      local_1e68.x.n[1] = (uint64_t)local_10e8;
      local_1e68.x.n[2] = (uint64_t)local_14f8;
      psVar77 = &local_1ba8;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1e68,psVar85,1,&local_1d18,&local_1bc8,psVar77);
      psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      cbdata = &local_1ef0;
      psVar86 = (secp256k1_gej *)scratch;
      iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0,
                               psVar77,ecmult_multi_callback,cbdata,1);
      if (iVar72 == 0) goto LAB_0015b5a4;
      psVar88 = (secp256k1_strauss_point_state *)local_1db0;
      iVar72 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,psVar85);
      psVar77 = (secp256k1_scalar *)((ulong)local_1ee0 & 0xffffffff);
      if (iVar72 == 0) goto LAB_0015b5a9;
      iVar72 = (int)local_1ee0 + 1;
    } while (iVar72 < COUNT);
    if (0 < COUNT) {
      uVar75 = 0;
      do {
        local_1ee0 = (secp256k1_scalar *)(ulong)uVar75;
        lVar76 = 0;
        do {
          psVar84 = &local_d38;
          lVar104 = 0;
          do {
            random_scalar_order((secp256k1_scalar *)((long)local_1bc8.d + lVar104));
            secp256k1_ge_set_infinity(psVar84);
            lVar104 = lVar104 + 0x20;
            psVar84 = psVar84 + 1;
          } while (lVar104 != 0x400);
          psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar77 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar97 = &local_1ef0;
          psVar85 = (secp256k1_gej *)scratch;
          iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0
                                   ,&secp256k1_scalar_zero,ecmult_multi_callback,ppsVar97,
                                   (&DAT_0017e300)[lVar76]);
          if (iVar72 == 0) goto LAB_0015b559;
          psVar88 = (secp256k1_strauss_point_state *)local_1db0;
          secp256k1_gej_verify((secp256k1_gej *)local_1db0);
          if (local_1db0._144_4_ == 0) goto LAB_0015b55e;
          lVar76 = lVar76 + 1;
        } while (lVar76 != 3);
        lVar76 = 0;
        do {
          psVar84 = &local_d38;
          lVar104 = 0;
          do {
            random_group_element_test((secp256k1_ge *)local_14f8);
            psVar87 = (secp256k1_ge *)local_14f8;
            psVar89 = psVar84;
            for (lVar78 = 0xd; lVar78 != 0; lVar78 = lVar78 + -1) {
              (psVar89->x).n[0] = (psVar87->x).n[0];
              psVar87 = (secp256k1_ge *)((long)psVar87 + (ulong)bVar105 * -0x10 + 8);
              psVar89 = (secp256k1_ge *)((long)psVar89 + ((ulong)bVar105 * -2 + 1) * 8);
            }
            *(undefined8 *)((long)local_1bc8.d + lVar104 + 0x10) = 0;
            *(undefined8 *)((long)local_1bc8.d + lVar104 + 0x18) = 0;
            *(undefined8 *)((long)local_1bc8.d + lVar104) = 0;
            *(undefined8 *)((long)local_1bc8.d + lVar104 + 8) = 0;
            lVar104 = lVar104 + 0x20;
            psVar84 = psVar84 + 1;
          } while (lVar104 != 0x400);
          psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar77 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar97 = &local_1ef0;
          psVar85 = (secp256k1_gej *)scratch;
          iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0
                                   ,&secp256k1_scalar_zero,ecmult_multi_callback,ppsVar97,
                                   (&DAT_0017e300)[lVar76]);
          if (iVar72 == 0) goto LAB_0015b563;
          psVar88 = (secp256k1_strauss_point_state *)local_1db0;
          secp256k1_gej_verify((secp256k1_gej *)local_1db0);
          if (local_1db0._144_4_ == 0) goto LAB_0015b568;
          lVar76 = lVar76 + 1;
        } while (lVar76 != 3);
        lVar76 = 0;
        do {
          random_group_element_test((secp256k1_ge *)local_14f8);
          lVar104 = 0x68;
          psVar77 = &local_1bc8;
          do {
            random_scalar_order(psVar77);
            secp256k1_scalar_negate(psVar77 + 1,psVar77);
            psVar84 = (secp256k1_ge *)local_14f8;
            puVar90 = (uint64_t *)((long)local_da0.x.n + lVar104);
            for (lVar78 = 0xd; lVar78 != 0; lVar78 = lVar78 + -1) {
              *puVar90 = (psVar84->x).n[0];
              psVar84 = (secp256k1_ge *)((long)psVar84 + (ulong)bVar105 * -0x10 + 8);
              puVar90 = puVar90 + (ulong)bVar105 * -2 + 1;
            }
            psVar84 = (secp256k1_ge *)local_14f8;
            puVar90 = (uint64_t *)((long)local_d38.x.n + lVar104);
            for (lVar78 = 0xd; lVar78 != 0; lVar78 = lVar78 + -1) {
              *puVar90 = (psVar84->x).n[0];
              psVar84 = (secp256k1_ge *)((long)psVar84 + (ulong)bVar105 * -0x10 + 8);
              puVar90 = puVar90 + (ulong)bVar105 * -2 + 1;
            }
            lVar104 = lVar104 + 0xd0;
            psVar77 = psVar77 + 2;
          } while (lVar104 != 0xd68);
          psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          sVar1 = (&DAT_0017e300)[lVar76];
          psVar77 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar97 = &local_1ef0;
          psVar85 = (secp256k1_gej *)scratch;
          iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0
                                   ,&secp256k1_scalar_zero,ecmult_multi_callback,ppsVar97,sVar1);
          if (iVar72 == 0) goto LAB_0015b56d;
          psVar88 = (secp256k1_strauss_point_state *)local_1db0;
          secp256k1_gej_verify((secp256k1_gej *)local_1db0);
          if (local_1db0._144_4_ == 0) goto LAB_0015b572;
          random_scalar_order(&local_1bc8);
          lVar104 = 0x20;
          psVar84 = &local_d38;
          do {
            random_group_element_test((secp256k1_ge *)local_14f8);
            uVar70 = local_1bc8.d[3];
            uVar69 = local_1bc8.d[1];
            *(uint64_t *)((long)local_1c60.z.n + lVar104 + 0x28) = local_1bc8.d[2];
            *(uint64_t *)((long)(&local_1c60.z + 1) + lVar104) = uVar70;
            *(uint64_t *)((long)local_1c60.z.n + lVar104 + 0x18) = local_1bc8.d[0];
            *(uint64_t *)((long)local_1c60.z.n + lVar104 + 0x20) = uVar69;
            *(uint64_t *)((long)local_1bc8.d + lVar104) = local_1bc8.d[0];
            *(uint64_t *)((long)local_1bc8.d + lVar104 + 8) = local_1bc8.d[1];
            *(uint64_t *)((long)local_1bc8.d + lVar104 + 0x10) = local_1bc8.d[2];
            *(uint64_t *)((long)local_1bc8.d + lVar104 + 0x18) = local_1bc8.d[3];
            psVar87 = (secp256k1_ge *)local_14f8;
            psVar89 = psVar84;
            for (lVar78 = 0xd; lVar78 != 0; lVar78 = lVar78 + -1) {
              (psVar89->x).n[0] = (psVar87->x).n[0];
              psVar87 = (secp256k1_ge *)((long)psVar87 + (ulong)bVar105 * -0x10 + 8);
              psVar89 = (secp256k1_ge *)((long)psVar89 + (ulong)bVar105 * -0x10 + 8);
            }
            secp256k1_ge_neg(psVar84 + 1,psVar84);
            lVar104 = lVar104 + 0x40;
            psVar84 = psVar84 + 2;
          } while (lVar104 != 0x420);
          psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar77 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          ppsVar97 = &local_1ef0;
          psVar85 = (secp256k1_gej *)scratch;
          iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0
                                   ,&secp256k1_scalar_zero,ecmult_multi_callback,ppsVar97,sVar1);
          if (iVar72 == 0) goto LAB_0015b577;
          psVar88 = (secp256k1_strauss_point_state *)local_1db0;
          secp256k1_gej_verify((secp256k1_gej *)local_1db0);
          if (local_1db0._144_4_ == 0) goto LAB_0015b57c;
          lVar76 = lVar76 + 1;
        } while (lVar76 != 3);
        random_group_element_test((secp256k1_ge *)local_14f8);
        local_1bc8.d[2] = 0;
        local_1bc8.d[3] = 0;
        local_1bc8.d[0] = 0;
        local_1bc8.d[1] = 0;
        psVar84 = (secp256k1_ge *)local_14f8;
        psVar87 = &local_d38;
        for (lVar76 = 0xd; lVar76 != 0; lVar76 = lVar76 + -1) {
          (psVar87->x).n[0] = (psVar84->x).n[0];
          psVar84 = (secp256k1_ge *)((long)psVar84 + (ulong)bVar105 * -0x10 + 8);
          psVar87 = (secp256k1_ge *)((long)psVar87 + ((ulong)bVar105 * -2 + 1) * 8);
        }
        lVar76 = 0x68;
        psVar77 = &local_1ba8;
        do {
          psVar84 = (secp256k1_ge *)local_14f8;
          puVar90 = (uint64_t *)((long)local_d38.x.n + lVar76);
          for (lVar104 = 0xd; lVar104 != 0; lVar104 = lVar104 + -1) {
            *puVar90 = (psVar84->x).n[0];
            psVar84 = (secp256k1_ge *)((long)psVar84 + (ulong)bVar105 * -0x10 + 8);
            puVar90 = puVar90 + (ulong)bVar105 * -2 + 1;
          }
          random_scalar_order(psVar77);
          secp256k1_scalar_add(&local_1bc8,&local_1bc8,psVar77);
          secp256k1_scalar_negate(psVar77,psVar77);
          lVar76 = lVar76 + 0x68;
          psVar77 = psVar77 + 1;
        } while (lVar76 != 0xd00);
        psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar77 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &local_1ef0;
        psVar85 = (secp256k1_gej *)scratch;
        iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0,
                                 &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x20);
        if (iVar72 == 0) goto LAB_0015b5ae;
        psVar88 = (secp256k1_strauss_point_state *)local_1db0;
        secp256k1_gej_verify((secp256k1_gej *)local_1db0);
        psVar77 = local_1ee0;
        if (local_1db0._144_4_ == 0) goto LAB_0015b5b3;
        uVar75 = (int)local_1ee0 + 1;
      } while ((int)uVar75 < COUNT);
      if (0 < COUNT) {
        iVar72 = 0;
        do {
          secp256k1_gej_set_infinity((secp256k1_gej *)local_1db0);
          random_scalar_order(&local_1bc8);
          psVar84 = &local_d38;
          lVar76 = 0;
          do {
            uVar71 = local_1bc8.d[3];
            uVar70 = local_1bc8.d[2];
            uVar69 = local_1bc8.d[1];
            *(uint64_t *)((long)local_1bc8.d + lVar76) = local_1bc8.d[0];
            *(uint64_t *)((long)local_1bc8.d + lVar76 + 8) = uVar69;
            *(uint64_t *)((long)local_1bc8.d + lVar76 + 0x10) = uVar70;
            *(uint64_t *)((long)local_1bc8.d + lVar76 + 0x18) = uVar71;
            random_group_element_test((secp256k1_ge *)local_14f8);
            psVar87 = (secp256k1_ge *)local_14f8;
            psVar89 = psVar84;
            for (lVar104 = 0xd; lVar104 != 0; lVar104 = lVar104 + -1) {
              (psVar89->x).n[0] = (psVar87->x).n[0];
              psVar87 = (secp256k1_ge *)((long)psVar87 + (ulong)bVar105 * -0x10 + 8);
              psVar89 = (secp256k1_ge *)((long)psVar89 + (ulong)bVar105 * -0x10 + 8);
            }
            secp256k1_gej_add_ge_var
                      ((secp256k1_gej *)local_1db0,(secp256k1_gej *)local_1db0,psVar84,
                       (secp256k1_fe *)0x0);
            lVar76 = lVar76 + 0x20;
            psVar84 = psVar84 + 1;
          } while (lVar76 != 0x280);
          local_1d18.x.n[0] = (uint64_t)local_1678;
          local_1d18.x.n[1] = (uint64_t)local_10e8;
          local_1d18.x.n[2] = (uint64_t)local_14f8;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1d18,&local_1710,1,
                     (secp256k1_gej *)local_1db0,&local_1bc8,&secp256k1_scalar_zero);
          psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
          psVar77 = &secp256k1_scalar_zero;
          cb = ecmult_multi_callback;
          cbdata = &local_1ef0;
          psVar85 = (secp256k1_gej *)scratch;
          iVar73 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)local_1db0
                                   ,&secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
          if (iVar73 == 0) goto LAB_0015b5b8;
          psVar85 = &local_1710;
          psVar88 = (secp256k1_strauss_point_state *)local_1db0;
          iVar73 = secp256k1_gej_eq_var((secp256k1_gej *)local_1db0,&local_1710);
          if (iVar73 == 0) goto LAB_0015b5bd;
          iVar72 = iVar72 + 1;
        } while (iVar72 < COUNT);
        if (0 < COUNT) {
          iVar72 = 0;
          do {
            local_1e68.x.n[2] = 0;
            local_1e68.x.n[3] = 0;
            local_1e68.x.n[0] = 0;
            local_1e68.x.n[1] = 0;
            random_group_element_test((secp256k1_ge *)&local_17a8);
            psVar77 = &local_1bc8;
            lVar76 = 0;
            do {
              random_scalar_order(psVar77);
              psVar85 = &local_17a8;
              puVar90 = (uint64_t *)((long)local_d38.x.n + lVar76);
              for (lVar104 = 0xd; lVar104 != 0; lVar104 = lVar104 + -1) {
                *puVar90 = (psVar85->x).n[0];
                psVar85 = (secp256k1_gej *)((long)psVar85 + (ulong)bVar105 * -0x10 + 8);
                puVar90 = puVar90 + (ulong)bVar105 * -2 + 1;
              }
              secp256k1_scalar_add
                        ((secp256k1_scalar *)&local_1e68,(secp256k1_scalar *)&local_1e68,psVar77);
              lVar76 = lVar76 + 0x68;
              psVar77 = psVar77 + 1;
            } while (lVar76 != 0x820);
            secp256k1_gej_set_ge(&local_1d18,&local_d38);
            local_1c60.x.n[0] = (uint64_t)local_1678;
            local_1c60.x.n[1] = (uint64_t)local_10e8;
            psVar86 = &local_1710;
            local_1c60.x.n[2] = (uint64_t)local_14f8;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)&local_1c60,psVar86,1,&local_1d18,
                       (secp256k1_scalar *)&local_1e68,&secp256k1_scalar_zero);
            psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
            psVar91 = (secp256k1_strauss_point_state *)local_1db0;
            psVar77 = &secp256k1_scalar_zero;
            cb = ecmult_multi_callback;
            cbdata = &local_1ef0;
            psVar85 = (secp256k1_gej *)scratch;
            iVar73 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,(secp256k1_gej *)psVar91,
                                     &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
            if (iVar73 == 0) goto LAB_0015b5c7;
            iVar73 = secp256k1_gej_eq_var((secp256k1_gej *)psVar91,psVar86);
            if (iVar73 == 0) goto LAB_0015b5cc;
            iVar72 = iVar72 + 1;
          } while (iVar72 < COUNT);
        }
      }
    }
  }
  lVar76 = 0;
  psVar84 = &local_d38;
  do {
    random_scalar_order((secp256k1_scalar *)((long)local_1bc8.d + lVar76));
    random_group_element_test(psVar84);
    psVar84 = psVar84 + 1;
    lVar76 = lVar76 + 0x20;
  } while (lVar76 != 0x280);
  local_1bc8.d[2] = 0;
  local_1bc8.d[3] = 0;
  local_1bc8.d[0] = 0;
  local_1bc8.d[1] = 0;
  psVar91 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar77 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1ef0;
  psVar86 = (secp256k1_gej *)scratch;
  iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar91,scratch,(secp256k1_gej *)local_1db0,
                           &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
  if (iVar72 == 0) goto LAB_0015b5d1;
  local_1b38 = 0;
  uStack_1b30 = 0;
  local_1b48 = 0;
  uStack_1b40 = 0;
  local_1b58 = 0;
  uStack_1b50 = 0;
  local_1b68 = 0;
  uStack_1b60 = 0;
  local_1b78 = 0;
  uStack_1b70 = 0;
  local_1b88 = 0;
  uStack_1b80 = 0;
  local_1ba8.d[2] = 0;
  local_1ba8.d[3] = 0;
  local_1ba8.d[0] = 0;
  local_1ba8.d[1] = 0;
  psVar91 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar77 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1ef0;
  psVar86 = (secp256k1_gej *)scratch;
  iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar91,scratch,(secp256k1_gej *)local_1db0,
                           &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,6);
  if (iVar72 == 0) goto LAB_0015b5d6;
  psVar91 = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar77 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1ef0;
  psVar86 = (secp256k1_gej *)scratch;
  iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar91,scratch,(secp256k1_gej *)local_1db0,
                           &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,5);
  if (iVar72 != 0) {
    psVar91 = (secp256k1_strauss_point_state *)local_1db0;
    secp256k1_gej_verify((secp256k1_gej *)psVar91);
    if (local_1db0._144_4_ != 0) {
      random_group_element_test(&local_da0);
      secp256k1_gej_set_ge(&local_1d18,&local_da0);
      local_1ed8 = 0;
      do {
        local_1ed0 = local_1ed8 + 1 >> 1;
        local_1ec8 = (ulong)((uint)local_1ed8 & 1);
        uVar74 = 0;
        local_1ed8 = local_1ed8 + 1;
        do {
          local_1dd0.d[3] = 0;
          local_1dd0.d[1] = 0;
          local_1dd0.d[2] = 0;
          local_1dd0.d[0] = local_1ed0;
          secp256k1_scalar_cond_negate(&local_1dd0,(int)local_1ec8);
          local_1ec0 = uVar74 + 1;
          local_1ea0.d[0] = local_1ec0 >> 1;
          local_1ea0.d[1] = 0;
          local_1ea0.d[2] = 0;
          local_1ea0.d[3] = 0;
          secp256k1_scalar_cond_negate(&local_1ea0,(uint)uVar74 & 1);
          local_1e68.x.n[2] = (uint64_t)local_14f8;
          local_1e68.x.n[0] = (uint64_t)local_1678;
          local_1e68.x.n[1] = (uint64_t)local_10e8;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1e68,&local_17a8,1,&local_1d18,&local_1dd0,
                     &secp256k1_scalar_zero);
          local_1c60.x.n[0] = (uint64_t)local_1678;
          local_1c60.x.n[1] = (uint64_t)local_10e8;
          local_1c60.x.n[2] = (uint64_t)local_14f8;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1c60,&local_1e68,1,&local_1d18,&local_1ea0,
                     &secp256k1_scalar_zero);
          local_1eb8 = 0;
          do {
            local_1eb0 = local_1eb8 + 1 >> 1;
            local_1ea8 = (ulong)((uint)local_1eb8 & 1);
            psVar77 = (secp256k1_scalar *)0x0;
            local_1eb8 = local_1eb8 + 1;
            do {
              secp256k1_ge_set_gej(&local_d38,&local_17a8);
              secp256k1_ge_set_gej(local_cd0,&local_1e68);
              local_1bc8.d[0] = local_1eb0;
              local_1bc8.d[3] = 0;
              local_1bc8.d[1] = 0;
              local_1bc8.d[2] = 0;
              secp256k1_scalar_cond_negate(&local_1bc8,(int)local_1ea8);
              local_1ee0 = (secp256k1_scalar *)((long)psVar77->d + 1);
              local_1ba8.d[0] = (ulong)local_1ee0 >> 1;
              local_1ba8.d[1] = 0;
              local_1ba8.d[2] = 0;
              local_1ba8.d[3] = 0;
              secp256k1_scalar_cond_negate(&local_1ba8,(uint)psVar77 & 1);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = local_1dd0.d[0];
              auVar34._8_8_ = 0;
              auVar34._0_8_ = local_1bc8.d[0];
              uVar79 = SUB168(auVar2 * auVar34,8);
              auVar67._8_8_ = 0;
              auVar67._0_8_ = uVar79;
              local_14f8._0_8_ = SUB168(auVar2 * auVar34,0);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_1dd0.d[0];
              auVar35._8_8_ = 0;
              auVar35._0_8_ = local_1bc8.d[1];
              auVar3 = auVar3 * auVar35;
              uVar92 = SUB168(auVar3 + auVar67,0);
              uVar98 = SUB168(auVar3 + auVar67,8);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = local_1dd0.d[1];
              auVar36._8_8_ = 0;
              auVar36._0_8_ = local_1bc8.d[0];
              uVar80 = SUB168(auVar4 * auVar36,8);
              uVar74 = SUB168(auVar4 * auVar36,0);
              local_14f8._8_8_ = uVar92 + uVar74;
              uVar74 = (ulong)CARRY8(uVar92,uVar74);
              uVar92 = uVar98 + uVar80;
              uVar99 = uVar92 + uVar74;
              uVar100 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar79,auVar3._0_8_)) +
                        (ulong)(CARRY8(uVar98,uVar80) || CARRY8(uVar92,uVar74));
              auVar5._8_8_ = 0;
              auVar5._0_8_ = local_1dd0.d[0];
              auVar37._8_8_ = 0;
              auVar37._0_8_ = local_1bc8.d[2];
              uVar81 = SUB168(auVar5 * auVar37,8);
              uVar74 = SUB168(auVar5 * auVar37,0);
              uVar79 = uVar99 + uVar74;
              uVar74 = (ulong)CARRY8(uVar99,uVar74);
              uVar80 = uVar100 + uVar81;
              uVar101 = uVar80 + uVar74;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = local_1dd0.d[1];
              auVar38._8_8_ = 0;
              auVar38._0_8_ = local_1bc8.d[1];
              uVar82 = SUB168(auVar6 * auVar38,8);
              uVar92 = SUB168(auVar6 * auVar38,0);
              uVar99 = uVar79 + uVar92;
              uVar92 = (ulong)CARRY8(uVar79,uVar92);
              uVar98 = uVar101 + uVar82;
              uVar102 = uVar98 + uVar92;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = local_1dd0.d[2];
              auVar39._8_8_ = 0;
              auVar39._0_8_ = local_1bc8.d[0];
              uVar83 = SUB168(auVar7 * auVar39,8);
              uVar79 = SUB168(auVar7 * auVar39,0);
              local_14f8._16_8_ = uVar99 + uVar79;
              uVar79 = (ulong)CARRY8(uVar99,uVar79);
              uVar99 = uVar102 + uVar83;
              uVar103 = uVar99 + uVar79;
              uVar93 = (ulong)(CARRY8(uVar100,uVar81) || CARRY8(uVar80,uVar74)) +
                       (ulong)(CARRY8(uVar101,uVar82) || CARRY8(uVar98,uVar92)) +
                       (ulong)(CARRY8(uVar102,uVar83) || CARRY8(uVar99,uVar79));
              auVar8._8_8_ = 0;
              auVar8._0_8_ = local_1dd0.d[0];
              auVar40._8_8_ = 0;
              auVar40._0_8_ = local_1bc8.d[3];
              uVar83 = SUB168(auVar8 * auVar40,8);
              uVar74 = SUB168(auVar8 * auVar40,0);
              uVar79 = uVar103 + uVar74;
              uVar74 = (ulong)CARRY8(uVar103,uVar74);
              uVar98 = uVar93 + uVar83;
              uVar103 = uVar98 + uVar74;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = local_1dd0.d[1];
              auVar41._8_8_ = 0;
              auVar41._0_8_ = local_1bc8.d[2];
              uVar100 = SUB168(auVar9 * auVar41,8);
              uVar92 = SUB168(auVar9 * auVar41,0);
              uVar80 = uVar79 + uVar92;
              uVar92 = (ulong)CARRY8(uVar79,uVar92);
              uVar99 = uVar103 + uVar100;
              uVar94 = uVar99 + uVar92;
              auVar10._8_8_ = 0;
              auVar10._0_8_ = local_1dd0.d[2];
              auVar42._8_8_ = 0;
              auVar42._0_8_ = local_1bc8.d[1];
              uVar101 = SUB168(auVar10 * auVar42,8);
              uVar79 = SUB168(auVar10 * auVar42,0);
              uVar82 = uVar80 + uVar79;
              uVar79 = (ulong)CARRY8(uVar80,uVar79);
              uVar81 = uVar94 + uVar101;
              uVar95 = uVar81 + uVar79;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = local_1dd0.d[3];
              auVar43._8_8_ = 0;
              auVar43._0_8_ = local_1bc8.d[0];
              uVar102 = SUB168(auVar11 * auVar43,8);
              uVar80 = SUB168(auVar11 * auVar43,0);
              local_14f8._24_8_ = uVar82 + uVar80;
              uVar80 = (ulong)CARRY8(uVar82,uVar80);
              uVar82 = uVar95 + uVar102;
              uVar96 = uVar82 + uVar80;
              uVar100 = (ulong)(CARRY8(uVar93,uVar83) || CARRY8(uVar98,uVar74)) +
                        (ulong)(CARRY8(uVar103,uVar100) || CARRY8(uVar99,uVar92)) +
                        (ulong)(CARRY8(uVar94,uVar101) || CARRY8(uVar81,uVar79)) +
                        (ulong)(CARRY8(uVar95,uVar102) || CARRY8(uVar82,uVar80));
              auVar12._8_8_ = 0;
              auVar12._0_8_ = local_1dd0.d[1];
              auVar44._8_8_ = 0;
              auVar44._0_8_ = local_1bc8.d[3];
              uVar81 = SUB168(auVar12 * auVar44,8);
              uVar74 = SUB168(auVar12 * auVar44,0);
              uVar79 = uVar96 + uVar74;
              uVar74 = (ulong)CARRY8(uVar96,uVar74);
              uVar80 = uVar100 + uVar81;
              uVar101 = uVar80 + uVar74;
              auVar13._8_8_ = 0;
              auVar13._0_8_ = local_1dd0.d[2];
              auVar45._8_8_ = 0;
              auVar45._0_8_ = local_1bc8.d[2];
              uVar82 = SUB168(auVar13 * auVar45,8);
              uVar92 = SUB168(auVar13 * auVar45,0);
              uVar99 = uVar79 + uVar92;
              uVar92 = (ulong)CARRY8(uVar79,uVar92);
              uVar98 = uVar101 + uVar82;
              uVar102 = uVar98 + uVar92;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = local_1dd0.d[3];
              auVar46._8_8_ = 0;
              auVar46._0_8_ = local_1bc8.d[1];
              uVar83 = SUB168(auVar14 * auVar46,8);
              uVar79 = SUB168(auVar14 * auVar46,0);
              local_14f8._32_8_ = uVar99 + uVar79;
              uVar79 = (ulong)CARRY8(uVar99,uVar79);
              uVar99 = uVar102 + uVar83;
              uVar93 = uVar99 + uVar79;
              uVar81 = (ulong)(CARRY8(uVar100,uVar81) || CARRY8(uVar80,uVar74)) +
                       (ulong)(CARRY8(uVar101,uVar82) || CARRY8(uVar98,uVar92)) +
                       (ulong)(CARRY8(uVar102,uVar83) || CARRY8(uVar99,uVar79));
              auVar15._8_8_ = 0;
              auVar15._0_8_ = local_1dd0.d[2];
              auVar47._8_8_ = 0;
              auVar47._0_8_ = local_1bc8.d[3];
              uVar98 = SUB168(auVar15 * auVar47,8);
              uVar74 = SUB168(auVar15 * auVar47,0);
              uVar80 = uVar93 + uVar74;
              uVar74 = (ulong)CARRY8(uVar93,uVar74);
              uVar79 = uVar81 + uVar98;
              uVar82 = uVar79 + uVar74;
              auVar16._8_8_ = 0;
              auVar16._0_8_ = local_1dd0.d[3];
              auVar48._8_8_ = 0;
              auVar48._0_8_ = local_1bc8.d[2];
              uVar99 = SUB168(auVar16 * auVar48,8);
              uVar92 = SUB168(auVar16 * auVar48,0);
              local_14f8._40_8_ = uVar80 + uVar92;
              uVar92 = (ulong)CARRY8(uVar80,uVar92);
              uVar80 = uVar82 + uVar99;
              local_14f8._56_8_ =
                   (ulong)(CARRY8(uVar81,uVar98) || CARRY8(uVar79,uVar74)) +
                   (ulong)(CARRY8(uVar82,uVar99) || CARRY8(uVar80,uVar92));
              local_14f8._48_8_ = uVar80 + uVar92;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = local_1dd0.d[3];
              auVar49._8_8_ = 0;
              auVar49._0_8_ = local_1bc8.d[3];
              local_14f8._48_16_ = auVar17 * auVar49 + local_14f8._48_16_;
              secp256k1_scalar_reduce_512(&local_1c80,(uint64_t *)local_14f8);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = local_1ea0.d[0];
              auVar50._8_8_ = 0;
              auVar50._0_8_ = local_1ba8.d[0];
              uVar79 = SUB168(auVar18 * auVar50,8);
              auVar68._8_8_ = 0;
              auVar68._0_8_ = uVar79;
              local_14f8._0_8_ = SUB168(auVar18 * auVar50,0);
              auVar19._8_8_ = 0;
              auVar19._0_8_ = local_1ea0.d[0];
              auVar51._8_8_ = 0;
              auVar51._0_8_ = local_1ba8.d[1];
              auVar19 = auVar19 * auVar51;
              uVar92 = SUB168(auVar19 + auVar68,0);
              uVar98 = SUB168(auVar19 + auVar68,8);
              auVar20._8_8_ = 0;
              auVar20._0_8_ = local_1ea0.d[1];
              auVar52._8_8_ = 0;
              auVar52._0_8_ = local_1ba8.d[0];
              uVar80 = SUB168(auVar20 * auVar52,8);
              uVar74 = SUB168(auVar20 * auVar52,0);
              local_14f8._8_8_ = uVar92 + uVar74;
              uVar74 = (ulong)CARRY8(uVar92,uVar74);
              uVar92 = uVar98 + uVar80;
              uVar99 = uVar92 + uVar74;
              uVar100 = (ulong)CARRY8(auVar19._8_8_,(ulong)CARRY8(uVar79,auVar19._0_8_)) +
                        (ulong)(CARRY8(uVar98,uVar80) || CARRY8(uVar92,uVar74));
              auVar21._8_8_ = 0;
              auVar21._0_8_ = local_1ea0.d[0];
              auVar53._8_8_ = 0;
              auVar53._0_8_ = local_1ba8.d[2];
              uVar81 = SUB168(auVar21 * auVar53,8);
              uVar74 = SUB168(auVar21 * auVar53,0);
              uVar79 = uVar99 + uVar74;
              uVar74 = (ulong)CARRY8(uVar99,uVar74);
              uVar80 = uVar100 + uVar81;
              uVar101 = uVar80 + uVar74;
              auVar22._8_8_ = 0;
              auVar22._0_8_ = local_1ea0.d[1];
              auVar54._8_8_ = 0;
              auVar54._0_8_ = local_1ba8.d[1];
              uVar82 = SUB168(auVar22 * auVar54,8);
              uVar92 = SUB168(auVar22 * auVar54,0);
              uVar99 = uVar79 + uVar92;
              uVar92 = (ulong)CARRY8(uVar79,uVar92);
              uVar98 = uVar101 + uVar82;
              uVar102 = uVar98 + uVar92;
              auVar23._8_8_ = 0;
              auVar23._0_8_ = local_1ea0.d[2];
              auVar55._8_8_ = 0;
              auVar55._0_8_ = local_1ba8.d[0];
              uVar83 = SUB168(auVar23 * auVar55,8);
              uVar79 = SUB168(auVar23 * auVar55,0);
              local_14f8._16_8_ = uVar99 + uVar79;
              uVar79 = (ulong)CARRY8(uVar99,uVar79);
              uVar99 = uVar102 + uVar83;
              uVar103 = uVar99 + uVar79;
              uVar93 = (ulong)(CARRY8(uVar100,uVar81) || CARRY8(uVar80,uVar74)) +
                       (ulong)(CARRY8(uVar101,uVar82) || CARRY8(uVar98,uVar92)) +
                       (ulong)(CARRY8(uVar102,uVar83) || CARRY8(uVar99,uVar79));
              auVar24._8_8_ = 0;
              auVar24._0_8_ = local_1ea0.d[0];
              auVar56._8_8_ = 0;
              auVar56._0_8_ = local_1ba8.d[3];
              uVar83 = SUB168(auVar24 * auVar56,8);
              uVar74 = SUB168(auVar24 * auVar56,0);
              uVar79 = uVar103 + uVar74;
              uVar74 = (ulong)CARRY8(uVar103,uVar74);
              uVar98 = uVar93 + uVar83;
              uVar103 = uVar98 + uVar74;
              auVar25._8_8_ = 0;
              auVar25._0_8_ = local_1ea0.d[1];
              auVar57._8_8_ = 0;
              auVar57._0_8_ = local_1ba8.d[2];
              uVar100 = SUB168(auVar25 * auVar57,8);
              uVar92 = SUB168(auVar25 * auVar57,0);
              uVar80 = uVar79 + uVar92;
              uVar92 = (ulong)CARRY8(uVar79,uVar92);
              uVar99 = uVar103 + uVar100;
              uVar94 = uVar99 + uVar92;
              auVar26._8_8_ = 0;
              auVar26._0_8_ = local_1ea0.d[2];
              auVar58._8_8_ = 0;
              auVar58._0_8_ = local_1ba8.d[1];
              uVar101 = SUB168(auVar26 * auVar58,8);
              uVar79 = SUB168(auVar26 * auVar58,0);
              uVar82 = uVar80 + uVar79;
              uVar79 = (ulong)CARRY8(uVar80,uVar79);
              uVar81 = uVar94 + uVar101;
              uVar95 = uVar81 + uVar79;
              auVar27._8_8_ = 0;
              auVar27._0_8_ = local_1ea0.d[3];
              auVar59._8_8_ = 0;
              auVar59._0_8_ = local_1ba8.d[0];
              uVar102 = SUB168(auVar27 * auVar59,8);
              uVar80 = SUB168(auVar27 * auVar59,0);
              local_14f8._24_8_ = uVar82 + uVar80;
              uVar80 = (ulong)CARRY8(uVar82,uVar80);
              uVar82 = uVar95 + uVar102;
              uVar96 = uVar82 + uVar80;
              uVar100 = (ulong)(CARRY8(uVar93,uVar83) || CARRY8(uVar98,uVar74)) +
                        (ulong)(CARRY8(uVar103,uVar100) || CARRY8(uVar99,uVar92)) +
                        (ulong)(CARRY8(uVar94,uVar101) || CARRY8(uVar81,uVar79)) +
                        (ulong)(CARRY8(uVar95,uVar102) || CARRY8(uVar82,uVar80));
              auVar28._8_8_ = 0;
              auVar28._0_8_ = local_1ea0.d[1];
              auVar60._8_8_ = 0;
              auVar60._0_8_ = local_1ba8.d[3];
              uVar81 = SUB168(auVar28 * auVar60,8);
              uVar74 = SUB168(auVar28 * auVar60,0);
              uVar79 = uVar96 + uVar74;
              uVar74 = (ulong)CARRY8(uVar96,uVar74);
              uVar80 = uVar100 + uVar81;
              uVar101 = uVar80 + uVar74;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = local_1ea0.d[2];
              auVar61._8_8_ = 0;
              auVar61._0_8_ = local_1ba8.d[2];
              uVar82 = SUB168(auVar29 * auVar61,8);
              uVar92 = SUB168(auVar29 * auVar61,0);
              uVar99 = uVar79 + uVar92;
              uVar92 = (ulong)CARRY8(uVar79,uVar92);
              uVar98 = uVar101 + uVar82;
              uVar102 = uVar98 + uVar92;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = local_1ea0.d[3];
              auVar62._8_8_ = 0;
              auVar62._0_8_ = local_1ba8.d[1];
              uVar83 = SUB168(auVar30 * auVar62,8);
              uVar79 = SUB168(auVar30 * auVar62,0);
              local_14f8._32_8_ = uVar99 + uVar79;
              uVar79 = (ulong)CARRY8(uVar99,uVar79);
              uVar99 = uVar102 + uVar83;
              uVar93 = uVar99 + uVar79;
              uVar81 = (ulong)(CARRY8(uVar100,uVar81) || CARRY8(uVar80,uVar74)) +
                       (ulong)(CARRY8(uVar101,uVar82) || CARRY8(uVar98,uVar92)) +
                       (ulong)(CARRY8(uVar102,uVar83) || CARRY8(uVar99,uVar79));
              auVar31._8_8_ = 0;
              auVar31._0_8_ = local_1ea0.d[2];
              auVar63._8_8_ = 0;
              auVar63._0_8_ = local_1ba8.d[3];
              uVar98 = SUB168(auVar31 * auVar63,8);
              uVar74 = SUB168(auVar31 * auVar63,0);
              uVar80 = uVar93 + uVar74;
              uVar74 = (ulong)CARRY8(uVar93,uVar74);
              uVar79 = uVar81 + uVar98;
              uVar82 = uVar79 + uVar74;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = local_1ea0.d[3];
              auVar64._8_8_ = 0;
              auVar64._0_8_ = local_1ba8.d[2];
              uVar99 = SUB168(auVar32 * auVar64,8);
              uVar92 = SUB168(auVar32 * auVar64,0);
              local_14f8._40_8_ = uVar80 + uVar92;
              uVar92 = (ulong)CARRY8(uVar80,uVar92);
              uVar80 = uVar82 + uVar99;
              auVar66._8_8_ =
                   (ulong)(CARRY8(uVar81,uVar98) || CARRY8(uVar79,uVar74)) +
                   (ulong)(CARRY8(uVar82,uVar99) || CARRY8(uVar80,uVar92));
              auVar66._0_8_ = uVar80 + uVar92;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = local_1ea0.d[3];
              auVar65._8_8_ = 0;
              auVar65._0_8_ = local_1ba8.d[3];
              local_14f8._48_16_ = auVar33 * auVar65 + auVar66;
              psVar86 = &local_1c60;
              psVar91 = (secp256k1_strauss_point_state *)local_14f8;
              secp256k1_scalar_reduce_512(&local_17c8,(uint64_t *)psVar91);
              secp256k1_scalar_add(&local_1c80,&local_1c80,&local_17c8);
              local_1e80.aux = local_1678;
              local_1e80.pre_a = local_10e8;
              local_1e80.ps = psVar91;
              secp256k1_ecmult_strauss_wnaf
                        (&local_1e80,psVar86,1,&local_1d18,&local_1c80,&secp256k1_scalar_zero);
              psVar88 = (secp256k1_strauss_point_state *)&CTX->error_callback;
              psVar77 = &secp256k1_scalar_zero;
              cb = ecmult_multi_callback;
              ppsVar97 = &local_1ef0;
              psVar85 = (secp256k1_gej *)scratch;
              iVar72 = (*ecmult_multi)((secp256k1_callback *)psVar88,scratch,
                                       (secp256k1_gej *)psVar91,&secp256k1_scalar_zero,
                                       ecmult_multi_callback,ppsVar97,2);
              if (iVar72 == 0) {
                test_ecmult_multi_cold_3();
LAB_0015b554:
                test_ecmult_multi_cold_2();
                goto LAB_0015b559;
              }
              iVar72 = secp256k1_gej_eq_var((secp256k1_gej *)psVar91,psVar86);
              psVar85 = psVar86;
              psVar88 = psVar91;
              if (iVar72 == 0) goto LAB_0015b554;
              psVar77 = local_1ee0;
            } while (local_1ee0 != (secp256k1_scalar *)0x8);
          } while (local_1eb8 != 8);
          uVar74 = local_1ec0;
        } while (local_1ec0 != 8);
        if (local_1ed8 == 8) {
          return;
        }
      } while( true );
    }
    goto LAB_0015b5e0;
  }
  goto LAB_0015b5db;
LAB_0015b559:
  test_ecmult_multi_cold_21();
LAB_0015b55e:
  test_ecmult_multi_cold_20();
LAB_0015b563:
  test_ecmult_multi_cold_19();
LAB_0015b568:
  test_ecmult_multi_cold_18();
LAB_0015b56d:
  test_ecmult_multi_cold_17();
LAB_0015b572:
  test_ecmult_multi_cold_16();
LAB_0015b577:
  test_ecmult_multi_cold_15();
LAB_0015b57c:
  test_ecmult_multi_cold_14();
LAB_0015b581:
  test_ecmult_multi_cold_29();
LAB_0015b586:
  test_ecmult_multi_cold_28();
LAB_0015b58b:
  psVar86 = psVar85;
  test_ecmult_multi_cold_27();
LAB_0015b590:
  test_ecmult_multi_cold_26();
LAB_0015b595:
  cbdata = ppsVar97;
  test_ecmult_multi_cold_1();
LAB_0015b59a:
  test_ecmult_multi_cold_25();
LAB_0015b59f:
  test_ecmult_multi_cold_24();
LAB_0015b5a4:
  psVar85 = psVar86;
  test_ecmult_multi_cold_23();
LAB_0015b5a9:
  test_ecmult_multi_cold_22();
LAB_0015b5ae:
  test_ecmult_multi_cold_13();
LAB_0015b5b3:
  test_ecmult_multi_cold_12();
LAB_0015b5b8:
  test_ecmult_multi_cold_11();
LAB_0015b5bd:
  test_ecmult_multi_cold_10();
LAB_0015b5c2:
  test_ecmult_multi_cold_30();
LAB_0015b5c7:
  psVar91 = psVar88;
  psVar86 = psVar85;
  test_ecmult_multi_cold_9();
LAB_0015b5cc:
  test_ecmult_multi_cold_8();
LAB_0015b5d1:
  test_ecmult_multi_cold_7();
LAB_0015b5d6:
  test_ecmult_multi_cold_6();
LAB_0015b5db:
  test_ecmult_multi_cold_5();
LAB_0015b5e0:
  test_ecmult_multi_cold_4();
  secp256k1_ecmult_pippenger_batch
            ((secp256k1_callback *)psVar91,(secp256k1_scratch *)psVar86,r_00,psVar77,cb,cbdata,
             (size_t)local_1f00,0);
  return;
}

Assistant:

static void test_ecmult_multi(secp256k1_scratch *scratch, secp256k1_ecmult_multi_func ecmult_multi) {
    int ncount;
    secp256k1_scalar sc[32];
    secp256k1_ge pt[32];
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;

    data.sc = sc;
    data.pt = pt;

    /* No points to multiply */
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0));

    /* Check 1- and 2-point multiplies against ecmult */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        random_scalar_order(&sc[0]);
        random_scalar_order(&sc[1]);

        random_group_element_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[0] = ptg;
        pt[1] = secp256k1_ge_const_g;

        /* only G scalar */
        secp256k1_ecmult(&r2, &ptgj, &secp256k1_scalar_zero, &sc[0]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 1-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* Try to multiply 1 point, but callback returns false */
        CHECK(!ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1));

        /* 2-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 2-point with G scalar */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check infinite outputs of various forms */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        size_t i, j;
        size_t sizes[] = { 2, 10, 32 };

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                random_scalar_order(&sc[i]);
                secp256k1_ge_set_infinity(&pt[i]);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                random_group_element_test(&ptg);
                pt[i] = ptg;
                secp256k1_scalar_set_int(&sc[i], 0);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            random_group_element_test(&ptg);
            for (i = 0; i < 16; i++) {
                random_scalar_order(&sc[2*i]);
                secp256k1_scalar_negate(&sc[2*i + 1], &sc[2*i]);
                pt[2 * i] = ptg;
                pt[2 * i + 1] = ptg;
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));

            random_scalar_order(&sc[0]);
            for (i = 0; i < 16; i++) {
                random_group_element_test(&ptg);

                sc[2*i] = sc[0];
                sc[2*i+1] = sc[0];
                pt[2 * i] = ptg;
                secp256k1_ge_neg(&pt[2*i+1], &pt[2*i]);
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        random_group_element_test(&ptg);
        secp256k1_scalar_set_int(&sc[0], 0);
        pt[0] = ptg;
        for (i = 1; i < 32; i++) {
            pt[i] = ptg;

            random_scalar_order(&sc[i]);
            secp256k1_scalar_add(&sc[0], &sc[0], &sc[i]);
            secp256k1_scalar_negate(&sc[i], &sc[i]);
        }

        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32));
        CHECK(secp256k1_gej_is_infinity(&r));
    }

    /* Check random points, constant scalar */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_gej_set_infinity(&r);

        random_scalar_order(&sc[0]);
        for (i = 0; i < 20; i++) {
            secp256k1_ge ptg;
            sc[i] = sc[0];
            random_group_element_test(&ptg);
            pt[i] = ptg;
            secp256k1_gej_add_ge_var(&r, &r, &pt[i], NULL);
        }

        secp256k1_ecmult(&r2, &r, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check random scalars, constant point */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_ge ptg;
        secp256k1_gej p0j;
        secp256k1_scalar rs;
        secp256k1_scalar_set_int(&rs, 0);

        random_group_element_test(&ptg);
        for (i = 0; i < 20; i++) {
            random_scalar_order(&sc[i]);
            pt[i] = ptg;
            secp256k1_scalar_add(&rs, &rs, &sc[i]);
        }

        secp256k1_gej_set_ge(&p0j, &pt[0]);
        secp256k1_ecmult(&r2, &p0j, &rs, &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Sanity check that zero scalars don't cause problems */
    for (ncount = 0; ncount < 20; ncount++) {
        random_scalar_order(&sc[ncount]);
        random_group_element_test(&pt[ncount]);
    }

    secp256k1_scalar_clear(&sc[0]);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
    secp256k1_scalar_clear(&sc[1]);
    secp256k1_scalar_clear(&sc[2]);
    secp256k1_scalar_clear(&sc[3]);
    secp256k1_scalar_clear(&sc[4]);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6));
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5));
    CHECK(secp256k1_gej_is_infinity(&r));

    /* Run through s0*(t0*P) + s1*(t1*P) exhaustively for many small values of s0, s1, t0, t1 */
    {
        const size_t TOP = 8;
        size_t s0i, s1i;
        size_t t0i, t1i;
        secp256k1_ge ptg;
        secp256k1_gej ptgj;

        random_group_element_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);

        for(t0i = 0; t0i < TOP; t0i++) {
            for(t1i = 0; t1i < TOP; t1i++) {
                secp256k1_gej t0p, t1p;
                secp256k1_scalar t0, t1;

                secp256k1_scalar_set_int(&t0, (t0i + 1) / 2);
                secp256k1_scalar_cond_negate(&t0, t0i & 1);
                secp256k1_scalar_set_int(&t1, (t1i + 1) / 2);
                secp256k1_scalar_cond_negate(&t1, t1i & 1);

                secp256k1_ecmult(&t0p, &ptgj, &t0, &secp256k1_scalar_zero);
                secp256k1_ecmult(&t1p, &ptgj, &t1, &secp256k1_scalar_zero);

                for(s0i = 0; s0i < TOP; s0i++) {
                    for(s1i = 0; s1i < TOP; s1i++) {
                        secp256k1_scalar tmp1, tmp2;
                        secp256k1_gej expected, actual;

                        secp256k1_ge_set_gej(&pt[0], &t0p);
                        secp256k1_ge_set_gej(&pt[1], &t1p);

                        secp256k1_scalar_set_int(&sc[0], (s0i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[0], s0i & 1);
                        secp256k1_scalar_set_int(&sc[1], (s1i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[1], s1i & 1);

                        secp256k1_scalar_mul(&tmp1, &t0, &sc[0]);
                        secp256k1_scalar_mul(&tmp2, &t1, &sc[1]);
                        secp256k1_scalar_add(&tmp1, &tmp1, &tmp2);

                        secp256k1_ecmult(&expected, &ptgj, &tmp1, &secp256k1_scalar_zero);
                        CHECK(ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
                        CHECK(secp256k1_gej_eq_var(&actual, &expected));
                    }
                }
            }
        }
    }
}